

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkCollapse(Abc_Ntk_t *pNtk,int fBddSizeMax,int fDualRail,int fReorder,int fReverse,
               int fDumpOrder,int fVerbose)

{
  DdManager *dd;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar5;
  long lVar6;
  long lVar7;
  int level;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                  ,0xd4,"Abc_Ntk_t *Abc_NtkCollapse(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  pvVar4 = Abc_NtkBuildGlobalBdds(pNtk,fBddSizeMax,1,fReorder,fReverse,fVerbose);
  if (pvVar4 != (void *)0x0) {
    if (fVerbose != 0) {
      if (pNtk->vAttrs->nSize < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      dd = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
      uVar2 = Cudd_ReadKeys(dd);
      uVar3 = Cudd_ReadDead(dd);
      iVar1 = 0x991478;
      printf("Shared BDD size = %6d nodes.  ",(ulong)(uVar2 - uVar3));
      Abc_Print(iVar1,"%s =","BDD construction time");
      level = 3;
      iVar1 = clock_gettime(3,&local_40);
      if (iVar1 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Abc_Print(level,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
    }
    if (fDumpOrder != 0) {
      Abc_NtkDumpVariableOrder(pNtk);
    }
    pNtk_00 = Abc_NtkFromGlobalBdds(pNtk,fReverse);
    Abc_NtkFreeGlobalBdds(pNtk,1);
    if (pNtk_00 != (Abc_Ntk_t *)0x0) {
      Abc_NtkMinimumBase2(pNtk_00);
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar5 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar5;
      }
      iVar1 = Abc_NtkCheck(pNtk_00);
      if (iVar1 != 0) {
        return pNtk_00;
      }
      puts("Abc_NtkCollapse: The network check has failed.");
      Abc_NtkDelete(pNtk_00);
    }
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkCollapse( Abc_Ntk_t * pNtk, int fBddSizeMax, int fDualRail, int fReorder, int fReverse, int fDumpOrder, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    // compute the global BDDs
    if ( Abc_NtkBuildGlobalBdds(pNtk, fBddSizeMax, 1, fReorder, fReverse, fVerbose) == NULL )
        return NULL;
    if ( fVerbose )
    {
        DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
        printf( "Shared BDD size = %6d nodes.  ", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );
        ABC_PRT( "BDD construction time", Abc_Clock() - clk );
    }
    if ( fDumpOrder ) 
        Abc_NtkDumpVariableOrder( pNtk );

    // create the new network
    pNtkNew = Abc_NtkFromGlobalBdds( pNtk, fReverse );
    Abc_NtkFreeGlobalBdds( pNtk, 1 );
    if ( pNtkNew == NULL )
        return NULL;

    // make the network minimum base
    Abc_NtkMinimumBase2( pNtkNew );

    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCollapse: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}